

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuCommandLine.cpp
# Opt level: O0

streamsize __thiscall
tcu::DebugOutStreambuf::xsputn(DebugOutStreambuf *this,char *s,streamsize count)

{
  long local_28;
  streamsize pos;
  streamsize count_local;
  char *s_local;
  DebugOutStreambuf *this_local;
  
  for (local_28 = 0; local_28 < count; local_28 = local_28 + 1) {
    std::ostream::put((char)this + '@');
    if (s[local_28] == '\n') {
      flushLine(this);
    }
  }
  return count;
}

Assistant:

std::streamsize DebugOutStreambuf::xsputn (const char* s, std::streamsize count)
{
	for (std::streamsize pos = 0; pos < count; pos++)
	{
		m_curLine.put(s[pos]);

		if (s[pos] == '\n')
			flushLine();
	}

	return count;
}